

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator-=(base_uint<256U> *this,uint64_t b64)

{
  base_uint<256U> *in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  base_uint<256U> b;
  undefined1 *b_00;
  base_uint<256U> *this_00;
  base_uint<256U> local_48;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b_00 = local_28;
  base_uint(in_RDI);
  operator=(in_RDI,(uint64_t)b_00);
  this_00 = &local_48;
  operator-(this_00);
  operator+=(in_RSI,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator-=(uint64_t b64)
    {
        base_uint b;
        b = b64;
        *this += -b;
        return *this;
    }